

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msg_tracing_helpers.hpp
# Opt level: O0

void so_5::impl::msg_tracing_helpers::details::make_trace_to_1(ostream *s,message_ref_t *message)

{
  message_mutability_t mVar1;
  ostream *poVar2;
  pointer local_60;
  pointer local_58;
  tuple<void_const*&,void_const*&> local_50 [16];
  tuple<const_void_*,_const_void_*> local_40;
  void *local_30;
  void *payload;
  void *envelope;
  anon_class_8_1_bc4532e7 detect_pointers;
  message_ref_t *message_local;
  ostream *s_local;
  
  payload = (void *)0x0;
  local_30 = (void *)0x0;
  envelope = message;
  detect_pointers.message = message;
  make_trace_to_1::anon_class_8_1_bc4532e7::operator()((anon_class_8_1_bc4532e7 *)&local_40);
  std::tie<void_const*,void_const*>((void **)local_50,&payload);
  std::tuple<void_const*&,void_const*&>::operator=(local_50,&local_40);
  if (payload != (void *)0x0) {
    poVar2 = std::operator<<(s,"[envelope_ptr=");
    so_5::details::ios_helpers::pointer::pointer(&local_58,payload);
    poVar2 = so_5::details::ios_helpers::operator<<(poVar2,&local_58);
    std::operator<<(poVar2,"]");
  }
  if (local_30 == (void *)0x0) {
    std::operator<<(s,"[signal]");
  }
  else {
    poVar2 = std::operator<<(s,"[payload_ptr=");
    so_5::details::ios_helpers::pointer::pointer(&local_60,local_30);
    poVar2 = so_5::details::ios_helpers::operator<<(poVar2,&local_60);
    std::operator<<(poVar2,"]");
  }
  mVar1 = message_mutability(detect_pointers.message);
  if (mVar1 == mutable_message) {
    std::operator<<(s,"[mutable]");
  }
  return;
}

Assistant:

inline void
make_trace_to_1( std::ostream & s, const message_ref_t & message )
	{
		// The first pointer is a pointer to envelope.
		// The second pointer is a pointer to payload.
		using msg_pointers = std::tuple< const void *, const void * >;

		auto detect_pointers = [&message]() -> msg_pointers {
			if( const message_t * envelope = message.get() )
				{
					// We can try cases with service requests and user-type messages.
					const void * payload =
							internal_message_iface_t{ *envelope }.payload_ptr();

					if( payload != envelope )
						// There are an envelope and payload inside it.
						return msg_pointers{ envelope, payload };
					else
						// There is only payload.
						return msg_pointers{ nullptr, envelope };
				}
			else
				// It is a signal there is nothing.
				return msg_pointers{ nullptr, nullptr };
		};

		const void * envelope = nullptr;
		const void * payload = nullptr;

		std::tie(envelope,payload) = detect_pointers();

		if( envelope )
			s << "[envelope_ptr=" << pointer{envelope} << "]";
		if( payload )
			s << "[payload_ptr=" << pointer{payload} << "]";
		else
			s << "[signal]";
		if( message_mutability_t::mutable_message == message_mutability(message) )
			s << "[mutable]";
	}